

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task20.cpp
# Opt level: O1

int main(void)

{
  int *arr;
  ostream *poVar1;
  ulong uVar2;
  int *piVar3;
  int size;
  long lVar4;
  int n;
  char local_2d;
  int local_2c;
  
  std::istream::operator>>((istream *)&std::cin,&local_2c);
  size = local_2c;
  lVar4 = (long)local_2c;
  uVar2 = 0xffffffffffffffff;
  if (-1 < lVar4) {
    uVar2 = lVar4 * 4;
  }
  arr = (int *)operator_new__(uVar2);
  if (0 < lVar4) {
    lVar4 = 0;
    piVar3 = arr;
    do {
      std::istream::operator>>((istream *)&std::cin,piVar3);
      lVar4 = lVar4 + 1;
      piVar3 = piVar3 + 1;
      size = local_2c;
    } while (lVar4 < local_2c);
  }
  bubble_sort(arr,size);
  if (0 < local_2c) {
    lVar4 = 0;
    do {
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,arr[lVar4]);
      local_2d = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_2d,1);
      lVar4 = lVar4 + 1;
    } while (lVar4 < local_2c);
  }
  operator_delete__(arr);
  return 0;
}

Assistant:

int main(){
    int n;
    cin >> n;
    int* arr = new int [n];
    for (int i = 0; i < n; i++) cin >> arr[i];
    bubble_sort(arr, n);
    for (int i = 0; i < n; i++) cout << arr[i] << ' ';
    delete[] arr;
    return 0;
}